

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopInsert(WhereLoopBuilder *pBuilder,WhereLoop *pTemplate)

{
  u8 uVar1;
  WhereInfo *pWVar2;
  sqlite3 *db;
  WhereLoop *p;
  Index *pIVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  undefined8 uVar6;
  u32 uVar7;
  u16 uVar8;
  u16 uVar9;
  u8 uVar10;
  LogEst LVar11;
  LogEst LVar12;
  LogEst LVar13;
  int iVar14;
  WhereLoop **ppWVar15;
  WhereLoop *pWVar16;
  short sVar17;
  
  if (pBuilder->iPlanLimit == 0) {
    iVar14 = 0x65;
    if (pBuilder->pOrSet != (WhereOrSet *)0x0) {
      pBuilder->pOrSet->n = 0;
    }
  }
  else {
    pWVar2 = pBuilder->pWInfo;
    db = pWVar2->pParse->db;
    pBuilder->iPlanLimit = pBuilder->iPlanLimit - 1;
    if (pBuilder->pOrSet == (WhereOrSet *)0x0) {
      pWVar16 = pWVar2->pLoops;
      if ((pWVar16 != (WhereLoop *)0x0) && ((pTemplate->wsFlags & 0x200) != 0)) {
        uVar1 = pTemplate->iTab;
        do {
          if ((pWVar16->iTab == uVar1) && ((pWVar16->wsFlags & 0x200) != 0)) {
            iVar14 = whereLoopCheaperProperSubset(pWVar16,pTemplate);
            sVar17 = -1;
            if (iVar14 == 0) {
              iVar14 = whereLoopCheaperProperSubset(pTemplate,pWVar16);
              sVar17 = 1;
              if (iVar14 == 0) goto LAB_0018655d;
            }
            pTemplate->rRun = pWVar16->rRun;
            pTemplate->nOut = sVar17 + pWVar16->nOut;
          }
LAB_0018655d:
          pWVar16 = pWVar16->pNextLoop;
        } while (pWVar16 != (WhereLoop *)0x0);
      }
      ppWVar15 = whereLoopFindLesser(&pWVar2->pLoops,pTemplate);
      if (ppWVar15 == (WhereLoop **)0x0) {
        iVar14 = 0;
      }
      else {
        pWVar16 = *ppWVar15;
        if (pWVar16 == (WhereLoop *)0x0) {
          pWVar16 = (WhereLoop *)sqlite3DbMallocRawNN(db,0x60);
          *ppWVar15 = pWVar16;
          if (pWVar16 == (WhereLoop *)0x0) {
            return 7;
          }
          pWVar16->aLTerm = pWVar16->aLTermSpace;
          pWVar16->nLTerm = 0;
          pWVar16->nLSlot = 3;
          pWVar16->wsFlags = 0;
          pWVar16->pNextLoop = (WhereLoop *)0x0;
        }
        else if (pWVar16->pNextLoop != (WhereLoop *)0x0) {
          ppWVar15 = &pWVar16->pNextLoop;
          do {
            ppWVar15 = whereLoopFindLesser(ppWVar15,pTemplate);
            if ((ppWVar15 == (WhereLoop **)0x0) || (p = *ppWVar15, p == (WhereLoop *)0x0)) break;
            *ppWVar15 = p->pNextLoop;
            whereLoopClear(db,p);
            sqlite3DbFreeNN(db,p);
          } while (*ppWVar15 != (WhereLoop *)0x0);
        }
        whereLoopClearUnion(db,pWVar16);
        iVar14 = whereLoopResize(db,pWVar16,(uint)pTemplate->nLTerm);
        if (iVar14 == 0) {
          BVar4 = pTemplate->prereq;
          BVar5 = pTemplate->maskSelf;
          uVar1 = pTemplate->iTab;
          uVar10 = pTemplate->iSortIdx;
          LVar11 = pTemplate->rSetup;
          LVar12 = pTemplate->rRun;
          LVar13 = pTemplate->nOut;
          uVar6 = *(undefined8 *)&pTemplate->u;
          uVar7 = pTemplate->wsFlags;
          uVar8 = pTemplate->nLTerm;
          uVar9 = pTemplate->nSkip;
          (pWVar16->u).btree.pIndex = (pTemplate->u).btree.pIndex;
          pWVar16->wsFlags = uVar7;
          pWVar16->nLTerm = uVar8;
          pWVar16->nSkip = uVar9;
          pWVar16->iTab = uVar1;
          pWVar16->iSortIdx = uVar10;
          pWVar16->rSetup = LVar11;
          pWVar16->rRun = LVar12;
          pWVar16->nOut = LVar13;
          *(undefined8 *)&pWVar16->u = uVar6;
          pWVar16->prereq = BVar4;
          pWVar16->maskSelf = BVar5;
          memcpy(pWVar16->aLTerm,pTemplate->aLTerm,(ulong)pWVar16->nLTerm << 3);
          if ((pTemplate->wsFlags >> 10 & 1) == 0) {
            iVar14 = 0;
            if ((pTemplate->wsFlags >> 0xe & 1) != 0) {
              (pTemplate->u).btree.pIndex = (Index *)0x0;
              iVar14 = 0;
            }
          }
          else {
            (pTemplate->u).vtab.needFree = '\0';
            iVar14 = 0;
          }
        }
        else {
          *(undefined8 *)&pWVar16->u = 0;
          (pWVar16->u).btree.pIndex = (Index *)0x0;
          iVar14 = 7;
        }
        if ((((pWVar16->wsFlags & 0x400) == 0) &&
            (pIVar3 = (pWVar16->u).btree.pIndex, pIVar3 != (Index *)0x0)) &&
           ((~*(ushort *)&pIVar3->field_0x63 & 3) == 0)) {
          (pWVar16->u).btree.pIndex = (Index *)0x0;
        }
      }
    }
    else {
      iVar14 = 0;
      if (pTemplate->nLTerm != 0) {
        whereOrInsert(pBuilder->pOrSet,pTemplate->prereq,pTemplate->rRun,pTemplate->nOut);
        iVar14 = 0;
      }
    }
  }
  return iVar14;
}

Assistant:

static int whereLoopInsert(WhereLoopBuilder *pBuilder, WhereLoop *pTemplate){
  WhereLoop **ppPrev, *p;
  WhereInfo *pWInfo = pBuilder->pWInfo;
  sqlite3 *db = pWInfo->pParse->db;
  int rc;

  /* Stop the search once we hit the query planner search limit */
  if( pBuilder->iPlanLimit==0 ){
    WHERETRACE(0xffffffff,("=== query planner search limit reached ===\n"));
    if( pBuilder->pOrSet ) pBuilder->pOrSet->n = 0;
    return SQLITE_DONE;
  }
  pBuilder->iPlanLimit--;

  /* If pBuilder->pOrSet is defined, then only keep track of the costs
  ** and prereqs.
  */
  if( pBuilder->pOrSet!=0 ){
    if( pTemplate->nLTerm ){
#if WHERETRACE_ENABLED
      u16 n = pBuilder->pOrSet->n;
      int x =
#endif
      whereOrInsert(pBuilder->pOrSet, pTemplate->prereq, pTemplate->rRun,
                                    pTemplate->nOut);
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(x?"   or-%d:  ":"   or-X:  ", n);
        whereLoopPrint(pTemplate, pBuilder->pWC);
      }
#endif
    }
    return SQLITE_OK;
  }

  /* Look for an existing WhereLoop to replace with pTemplate
  */
  whereLoopAdjustCost(pWInfo->pLoops, pTemplate);
  ppPrev = whereLoopFindLesser(&pWInfo->pLoops, pTemplate);

  if( ppPrev==0 ){
    /* There already exists a WhereLoop on the list that is better
    ** than pTemplate, so just ignore pTemplate */
#if WHERETRACE_ENABLED /* 0x8 */
    if( sqlite3WhereTrace & 0x8 ){
      sqlite3DebugPrintf("   skip: ");
      whereLoopPrint(pTemplate, pBuilder->pWC);
    }
#endif
    return SQLITE_OK;  
  }else{
    p = *ppPrev;
  }

  /* If we reach this point it means that either p[] should be overwritten
  ** with pTemplate[] if p[] exists, or if p==NULL then allocate a new
  ** WhereLoop and insert it.
  */
#if WHERETRACE_ENABLED /* 0x8 */
  if( sqlite3WhereTrace & 0x8 ){
    if( p!=0 ){
      sqlite3DebugPrintf("replace: ");
      whereLoopPrint(p, pBuilder->pWC);
      sqlite3DebugPrintf("   with: ");
    }else{
      sqlite3DebugPrintf("    add: ");
    }
    whereLoopPrint(pTemplate, pBuilder->pWC);
  }
#endif
  if( p==0 ){
    /* Allocate a new WhereLoop to add to the end of the list */
    *ppPrev = p = sqlite3DbMallocRawNN(db, sizeof(WhereLoop));
    if( p==0 ) return SQLITE_NOMEM_BKPT;
    whereLoopInit(p);
    p->pNextLoop = 0;
  }else{
    /* We will be overwriting WhereLoop p[].  But before we do, first
    ** go through the rest of the list and delete any other entries besides
    ** p[] that are also supplated by pTemplate */
    WhereLoop **ppTail = &p->pNextLoop;
    WhereLoop *pToDel;
    while( *ppTail ){
      ppTail = whereLoopFindLesser(ppTail, pTemplate);
      if( ppTail==0 ) break;
      pToDel = *ppTail;
      if( pToDel==0 ) break;
      *ppTail = pToDel->pNextLoop;
#if WHERETRACE_ENABLED /* 0x8 */
      if( sqlite3WhereTrace & 0x8 ){
        sqlite3DebugPrintf(" delete: ");
        whereLoopPrint(pToDel, pBuilder->pWC);
      }
#endif
      whereLoopDelete(db, pToDel);
    }
  }
  rc = whereLoopXfer(db, p, pTemplate);
  if( (p->wsFlags & WHERE_VIRTUALTABLE)==0 ){
    Index *pIndex = p->u.btree.pIndex;
    if( pIndex && pIndex->idxType==SQLITE_IDXTYPE_IPK ){
      p->u.btree.pIndex = 0;
    }
  }
  return rc;
}